

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O2

String * __thiscall
asl::TextFile::readLine(String *__return_storage_ptr__,TextFile *this,char newline)

{
  char b;
  bool bVar1;
  int iVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  int __oflag;
  
  String::String(__return_storage_ptr__,1000,0);
  if (__return_storage_ptr__->_size == 0) {
    paVar3 = &__return_storage_ptr__->field_2;
  }
  else {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
  }
  paVar3->_space[0] = '\0';
  if (((this->super_File)._file == (FILE *)0x0) &&
     (iVar2 = open(this,(char *)0x0,__oflag), (char)iVar2 == '\0')) {
    return __return_storage_ptr__;
  }
  while( true ) {
    b = File::read<char>(&this->super_File);
    bVar1 = end(this);
    if (b == newline || bVar1) break;
    String::operator+=(__return_storage_ptr__,b);
  }
  return __return_storage_ptr__;
}

Assistant:

String TextFile::readLine(char newline)
{
	String s(1000, 0);
	s[0] = '\0';
	if(!_file && !open(READ))
		return s;
	while (1)
	{
		char c = read<char>();
		if (end() || c == newline)
			break;
		s << c;
	}
	return s;
}